

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_transform_coordinates_3d(ALLEGRO_TRANSFORM *trans,float *x,float *y,float *z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float rz;
  float ry;
  float rx;
  float *z_local;
  float *y_local;
  float *x_local;
  ALLEGRO_TRANSFORM *trans_local;
  
  fVar1 = trans->m[0][1];
  fVar2 = *x;
  fVar3 = trans->m[1][1];
  fVar4 = *y;
  fVar5 = trans->m[2][1];
  fVar6 = *z;
  fVar7 = trans->m[3][1];
  fVar8 = trans->m[0][2];
  fVar9 = *x;
  fVar10 = trans->m[1][2];
  fVar11 = *y;
  fVar12 = trans->m[2][2];
  fVar13 = *z;
  fVar14 = trans->m[3][2];
  *x = trans->m[2][0] * *z + trans->m[0][0] * *x + trans->m[1][0] * *y + trans->m[3][0];
  *y = fVar5 * fVar6 + fVar1 * fVar2 + fVar3 * fVar4 + fVar7;
  *z = fVar12 * fVar13 + fVar8 * fVar9 + fVar10 * fVar11 + fVar14;
  return;
}

Assistant:

void al_transform_coordinates_3d(const ALLEGRO_TRANSFORM *trans,
   float *x, float *y, float *z)
{
   float rx, ry, rz;
   ASSERT(trans);
   ASSERT(x);
   ASSERT(y);
   ASSERT(z);

   #define M(i, j) trans->m[i][j]

   rx = M(0, 0) * *x + M(1, 0) * *y + M(2, 0) * *z + M(3, 0);
   ry = M(0, 1) * *x + M(1, 1) * *y + M(2, 1) * *z + M(3, 1);
   rz = M(0, 2) * *x + M(1, 2) * *y + M(2, 2) * *z + M(3, 2);

   #undef M

   *x = rx;
   *y = ry;
   *z = rz;
}